

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall
Reducer::tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::
FunctionReferenceRemover::FunctionReferenceRemover(std::vector<wasm::Name,std::allocator<wasm::
Name>_>__(void *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *vec)

{
  bool bVar1;
  reference pNVar2;
  undefined1 auStack_48 [8];
  Name name;
  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_30;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *vec_local;
  FunctionReferenceRemover *this_local;
  
  wasm::PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>::
  PostWalker((PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_> *
             )this);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)((long)this + 0xd8));
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)this + 0x110));
  __end2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(vec);
  local_30._M_current = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(vec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_30);
    if (!bVar1) break;
    pNVar2 = __gnu_cxx::
             __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end2);
    auStack_48 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              *)((long)this + 0xd8),(value_type *)auStack_48);
    __gnu_cxx::
    __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

FunctionReferenceRemover(std::vector<Name>& vec) {
        for (auto name : vec) {
          names.insert(name);
        }
      }